

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::LoadRevisions(cmCTestP4 *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  reference ppcVar5;
  undefined1 local_6f8 [8];
  OutputLogger errDescribe;
  DescribeParser outDescribe;
  value_type local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 local_390 [16];
  reverse_iterator i;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_describe;
  OutputLogger err;
  ChangesParser out;
  value_type local_208;
  char *local_200;
  undefined4 local_1f4;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_58 [8];
  string range;
  undefined1 local_28 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> p4_changes;
  cmCTestP4 *this_local;
  
  p4_changes.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
  bVar1 = std::operator==(&(this->super_cmCTestGlobalVC).OldRevision,"<unknown>");
  if (!bVar1) {
    bVar1 = std::operator==(&(this->super_cmCTestGlobalVC).NewRevision,"<unknown>");
    if (!bVar1) {
      psVar3 = (string *)std::__cxx11::string::append(local_58);
      pcVar4 = (char *)std::__cxx11::string::append(psVar3);
      psVar3 = (string *)std::__cxx11::string::append(pcVar4);
      std::__cxx11::string::append(psVar3);
      local_200 = "changes";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,&local_200);
      local_208 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,&local_208);
      out.P4 = (cmCTestP4 *)0x0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,
                 (value_type *)&out.P4);
      ChangesParser::ChangesParser
                ((ChangesParser *)&err.super_LineParser.Separator,this,"p4_changes-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)
                 &p4_describe.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_changes-err> ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->ChangeLists);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,0);
      cmCTestVC::RunChild((cmCTestVC *)this,ppcVar5,(OutputParser *)&err.super_LineParser.Separator,
                          (OutputParser *)
                          &p4_describe.
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(char *)0x0);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->ChangeLists);
      if (bVar1) {
        local_1f4 = 1;
      }
      else {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::rbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_390 + 8));
        while( true ) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::rend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_390);
          bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)(local_390 + 8),
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_390);
          if (!bVar1) break;
          SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&i);
          local_398 = "describe";
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i,&local_398);
          local_3a0 = "-s";
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i,&local_3a0);
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)(local_390 + 8));
          local_3a8 = (value_type)std::__cxx11::string::c_str();
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i,&local_3a8);
          outDescribe.Rev.Log.field_2._8_8_ = 0;
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i,
                     (value_type *)((long)&outDescribe.Rev.Log.field_2 + 8));
          DescribeParser::DescribeParser
                    ((DescribeParser *)&errDescribe.super_LineParser.Separator,this,
                     "p4_describe-out> ");
          cmProcessTools::OutputLogger::OutputLogger
                    ((OutputLogger *)local_6f8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                     "p4_describe-err> ");
          ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i,0);
          cmCTestVC::RunChild((cmCTestVC *)this,ppcVar5,
                              (OutputParser *)&errDescribe.super_LineParser.Separator,
                              (OutputParser *)local_6f8,(char *)0x0);
          cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_6f8);
          DescribeParser::~DescribeParser((DescribeParser *)&errDescribe.super_LineParser.Separator)
          ;
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)(local_390 + 8));
        }
        std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&i);
        local_1f4 = 0;
      }
      cmProcessTools::OutputLogger::~OutputLogger
                ((OutputLogger *)
                 &p4_describe.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ChangesParser::~ChangesParser((ChangesParser *)&err.super_LineParser.Separator);
      goto LAB_00578f69;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar2 = std::operator<<((ostream *)local_1d0,"   At least one of the revisions ");
  std::operator<<(poVar2,"is unknown. No repository changes will be reported.\n");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestP4.cxx"
               ,0x1b1,pcVar4,false);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  local_1f4 = 1;
LAB_00578f69:
  std::__cxx11::string::~string((string *)local_58);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  return;
}

Assistant:

void cmCTestP4::LoadRevisions()
{
  std::vector<char const*> p4_changes;
  SetP4Options(p4_changes);

  // Use 'p4 changes ...@old,new' to get a list of changelists
  std::string range = this->SourceDirectory + "/...";

  // If any revision is unknown it means we couldn't contact the server.
  // Do not process updates
  if(this->OldRevision == "<unknown>" || this->NewRevision == "<unknown>")
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "   At least one of the revisions "
               << "is unknown. No repository changes will be reported.\n");
    return;
    }

  range.append("@").append(this->OldRevision)
       .append(",").append(this->NewRevision);

  p4_changes.push_back("changes");
  p4_changes.push_back(range.c_str());
  p4_changes.push_back(0);

  ChangesParser out(this, "p4_changes-out> ");
  OutputLogger err(this->Log, "p4_changes-err> ");

  ChangeLists.clear();
  this->RunChild(&p4_changes[0], &out, &err);

  if(ChangeLists.empty())
      return;

  //p4 describe -s ...@1111111,2222222
  std::vector<char const*> p4_describe;
  for(std::vector<std::string>::reverse_iterator i = ChangeLists.rbegin();
      i != ChangeLists.rend(); ++i)
    {
    SetP4Options(p4_describe);
    p4_describe.push_back("describe");
    p4_describe.push_back("-s");
    p4_describe.push_back(i->c_str());
    p4_describe.push_back(0);

    DescribeParser outDescribe(this, "p4_describe-out> ");
    OutputLogger errDescribe(this->Log, "p4_describe-err> ");
    this->RunChild(&p4_describe[0], &outDescribe, &errDescribe);
    }
}